

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O1

OpenMPClause * __thiscall OpenMPDirective::addOpenMPClause(OpenMPDirective *this,int k,...)

{
  _Rb_tree_header *p_Var1;
  map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
  *this_00;
  mapped_type pvVar2;
  pointer ppOVar3;
  iterator __position;
  OpenMPClauseKind OVar4;
  OpenMPMapClauseModifier modifier2;
  OpenMPMapClauseModifier modifier3;
  OpenMPMapClauseType type;
  char in_AL;
  mapped_type *ppvVar5;
  ostream *poVar6;
  OpenMPClause *pOVar7;
  vector<OpenMPClause*,std::allocator<OpenMPClause*>> *pvVar8;
  undefined8 uVar9;
  char *in_RCX;
  _Base_ptr p_Var10;
  char *pcVar11;
  undefined8 in_RDX;
  _Base_ptr p_Var12;
  char *in_R8;
  char *in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  OpenMPClause *new_clause;
  OpenMPClauseKind kind;
  string mapper_identifier;
  OpenMPClause *local_140;
  OpenMPClauseKind local_134;
  allocator<char> local_12d;
  OpenMPAffinityClauseModifier local_12c;
  string local_128;
  pair<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*> local_108;
  long local_f8 [4];
  undefined8 local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  p_Var1 = &(this->clauses)._M_t._M_impl.super__Rb_tree_header;
  p_Var12 = (this->clauses)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var10 = &p_Var1->_M_header;
  for (; p_Var12 != (_Base_ptr)0x0; p_Var12 = (&p_Var12->_M_left)[(int)p_Var12[1]._M_color < k]) {
    if (k <= (int)p_Var12[1]._M_color) {
      p_Var10 = p_Var12;
    }
  }
  p_Var12 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var10 != p_Var1) && (p_Var12 = p_Var10, k < (int)p_Var10[1]._M_color)) {
    p_Var12 = &p_Var1->_M_header;
  }
  this_00 = &this->clauses;
  local_134 = k;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((_Rb_tree_header *)p_Var12 == p_Var1) {
    local_108.second = (vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)operator_new(0x18)
    ;
    ((local_108.second)->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_108.second)->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_108.second)->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.first = k;
    std::
    _Rb_tree<OpenMPClauseKind,std::pair<OpenMPClauseKind_const,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>,std::_Select1st<std::pair<OpenMPClauseKind_const,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>>,std::less<OpenMPClauseKind>,std::allocator<std::pair<OpenMPClauseKind_const,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>>>
    ::
    _M_emplace_unique<std::pair<OpenMPClauseKind,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>>
              ((_Rb_tree<OpenMPClauseKind,std::pair<OpenMPClauseKind_const,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>,std::_Select1st<std::pair<OpenMPClauseKind_const,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>>,std::less<OpenMPClauseKind>,std::allocator<std::pair<OpenMPClauseKind_const,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>>>
                *)this_00,&local_108);
  }
  local_108.first = local_134;
  ppvVar5 = std::
            map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
            ::operator[](this_00,&local_108.first);
  OVar4 = local_134;
  pvVar2 = *ppvVar5;
  local_140 = (OpenMPClause *)0x0;
  modifier2 = (OpenMPMapClauseModifier)local_d0;
  modifier3 = (OpenMPMapClauseModifier)local_c8;
  switch(local_134) {
  case OMPC_if:
    pcVar11 = local_d0;
    if ((OpenMPAffinityClauseModifier)local_d8 != 0xc) {
      pcVar11 = (char *)0x0;
    }
    local_140 = OpenMPIfClause::addIfClause(this,(OpenMPAffinityClauseModifier)local_d8,pcVar11);
    break;
  case OMPC_num_threads:
  case OMPC_private:
  case OMPC_firstprivate:
  case OMPC_shared:
  case OMPC_copyin:
  case OMPC_align:
  case OMPC_num_teams:
  case OMPC_thread_limit:
  case OMPC_collapse:
  case OMPC_ordered:
  case OMPC_partial:
  case OMPC_nowait:
  case OMPC_full:
  case OMPC_safelen:
  case OMPC_simdlen:
  case OMPC_nontemporal:
  case OMPC_uniform:
  case OMPC_inbranch:
  case OMPC_notinbranch:
  case OMPC_inclusive:
  case OMPC_exclusive:
  case OMPC_copyprivate:
  case OMPC_parallel:
  case OMPC_sections:
  case OMPC_for:
  case OMPC_do:
  case OMPC_taskgroup:
  case OMPC_final:
  case OMPC_untied:
  case OMPC_mergeable:
  case OMPC_priority:
  case OMPC_detach:
  case OMPC_grainsize:
  case OMPC_num_tasks:
  case OMPC_nogroup:
  case OMPC_reverse_offload:
  case OMPC_unified_address:
  case OMPC_unified_shared_memory:
  case OMPC_dynamic_allocators:
  case OMPC_use_device_ptr:
  case OMPC_sizes:
  case OMPC_use_device_addr:
  case OMPC_is_device_ptr:
  case OMPC_has_device_addr:
  case OMPC_link:
  case OMPC_acq_rel:
  case OMPC_release:
  case OMPC_acquire:
  case OMPC_read:
  case OMPC_write:
  case OMPC_update:
  case OMPC_capture:
  case OMPC_seq_cst:
  case OMPC_relaxed:
  case OMPC_hint:
  case OMPC_destroy:
  case OMPC_threads:
  case OMPC_simd:
    ppOVar3 = (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
        super__Vector_impl_data._M_finish == ppOVar3) {
      pOVar7 = (OpenMPClause *)operator_new(0x68);
      (pOVar7->super_SourceLocation).line = 0;
      (pOVar7->super_SourceLocation).column = 0;
      (pOVar7->super_SourceLocation).parent_construct = (SourceLocation *)0x0;
      pOVar7->_vptr_OpenMPClause = (_func_int **)&PTR_toString_abi_cxx11__001bb290;
      pOVar7->kind = OVar4;
      pOVar7->clause_position = -1;
      (pOVar7->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pOVar7->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pOVar7->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pOVar7->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pOVar7->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pOVar7->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pOVar7->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pOVar7->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pOVar7->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_140 = pOVar7;
      pvVar8 = (vector<OpenMPClause*,std::allocator<OpenMPClause*>> *)operator_new(0x18);
      *(undefined8 *)pvVar8 = 0;
      *(undefined8 *)(pvVar8 + 8) = 0;
      *(undefined8 *)(pvVar8 + 0x10) = 0;
      if (*(undefined8 **)(pvVar8 + 8) == (undefined8 *)0x0) {
        std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>::
        _M_realloc_insert<OpenMPClause*const&>(pvVar8,(iterator)0x0,&local_140);
      }
      else {
        **(undefined8 **)(pvVar8 + 8) = pOVar7;
        *(long *)(pvVar8 + 8) = *(long *)(pvVar8 + 8) + 8;
      }
      ppvVar5 = std::
                map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
                ::operator[](this_00,&local_134);
      *ppvVar5 = (mapped_type)pvVar8;
      break;
    }
    if (local_134 == OMPC_num_threads) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot have two num_threads clause for the directive ",0x35)
      ;
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_134);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ignored\n",10);
    }
    else {
      local_140 = *ppOVar3;
    }
    if (local_134 == OMPC_simdlen) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot have two simdlen clause for the directive ",0x31);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_134);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ignored\n",10);
    }
    else {
      ppOVar3 = (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
          super__Vector_impl_data._M_finish == ppOVar3) goto LAB_00181a32;
      local_140 = *ppOVar3;
    }
    if (local_134 == OMPC_safelen) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot have two safelen clause for the directive ",0x31);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_134);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ignored\n",10);
    }
    else {
      ppOVar3 = (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
          super__Vector_impl_data._M_finish == ppOVar3) goto LAB_00181a32;
      local_140 = *ppOVar3;
    }
    if (local_134 == OMPC_seq_cst) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot have two seq_cst clause for the directive ",0x31);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_134);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ignored\n",10);
    }
    else {
      ppOVar3 = (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
          super__Vector_impl_data._M_finish == ppOVar3) goto LAB_00181a32;
      local_140 = *ppOVar3;
    }
    if (local_134 == OMPC_acq_rel) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot have two acq_rel clause for the directive ",0x31);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_134);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ignored\n",10);
    }
    else {
      ppOVar3 = (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
          super__Vector_impl_data._M_finish == ppOVar3) goto LAB_00181a32;
      local_140 = *ppOVar3;
    }
    if (local_134 == OMPC_release) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot have two release clause for the directive ",0x31);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_134);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ignored\n",10);
    }
    else {
      ppOVar3 = (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
          super__Vector_impl_data._M_finish == ppOVar3) goto LAB_00181a32;
      local_140 = *ppOVar3;
    }
    if (local_134 == OMPC_acquire) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot have two acquire clause for the directive ",0x31);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_134);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ignored\n",10);
    }
    else {
      ppOVar3 = (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
          super__Vector_impl_data._M_finish == ppOVar3) goto LAB_00181a32;
      local_140 = *ppOVar3;
    }
    if (local_134 == OMPC_relaxed) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot have two relaxed clause for the directive ",0x31);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_134);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ignored\n",10);
    }
    else {
      ppOVar3 = (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
          super__Vector_impl_data._M_finish == ppOVar3) goto LAB_00181a32;
      local_140 = *ppOVar3;
    }
    if (local_134 == OMPC_hint) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot have two hint clause for the directive ",0x2e);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_134);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ignored\n",10);
    }
    else {
      ppOVar3 = (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
          super__Vector_impl_data._M_finish == ppOVar3) {
LAB_00181a32:
        uVar9 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
        if (local_128._M_dataplus._M_p != (pointer)(ulong)(uint)k) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_108._4_4_,local_108.first) != local_f8) {
          operator_delete((long *)CONCAT44(local_108._4_4_,local_108.first),local_f8[0] + 1);
        }
        _Unwind_Resume(uVar9);
      }
      local_140 = *ppOVar3;
    }
    break;
  case OMPC_default:
    local_140 = OpenMPDefaultClause::addDefaultClause(this,(OpenMPAffinityClauseModifier)local_d8);
    break;
  case OMPC_reduction:
    pcVar11 = local_c8;
    if ((OpenMPMapClauseModifier)local_d0 != 0xc) {
      pcVar11 = (char *)0x0;
    }
    local_140 = OpenMPReductionClause::addReductionClause
                          (this,(OpenMPAffinityClauseModifier)local_d8,
                           (OpenMPMapClauseModifier)local_d0,pcVar11);
    break;
  case OMPC_proc_bind:
    local_140 = OpenMPProcBindClause::addProcBindClause(this,(OpenMPAffinityClauseModifier)local_d8)
    ;
    break;
  case OMPC_allocate:
    pcVar11 = local_d0;
    if ((OpenMPAffinityClauseModifier)local_d8 != 8) {
      pcVar11 = (char *)0x0;
    }
    local_140 = OpenMPAllocateClause::addAllocateClause
                          (this,(OpenMPAffinityClauseModifier)local_d8,pcVar11);
    break;
  case OMPC_lastprivate:
    local_140 = OpenMPLastprivateClause::addLastprivateClause
                          (this,(OpenMPAffinityClauseModifier)local_d8);
    break;
  case OMPC_order:
    local_140 = OpenMPOrderClause::addOrderClause(this,(OpenMPAffinityClauseModifier)local_d8);
    break;
  case OMPC_linear:
    local_140 = OpenMPLinearClause::addLinearClause(this,(OpenMPAffinityClauseModifier)local_d8);
    break;
  case OMPC_schedule:
    pcVar11 = local_c0;
    if ((OpenMPMapClauseModifier)local_c8 != 5) {
      pcVar11 = (char *)0x0;
    }
    local_140 = OpenMPScheduleClause::addScheduleClause
                          (this,(OpenMPAffinityClauseModifier)local_d8,
                           (OpenMPMapClauseModifier)local_d0,(OpenMPMapClauseModifier)local_c8,
                           pcVar11);
    break;
  case OMPC_aligned:
    local_140 = OpenMPAlignedClause::addAlignedClause(this);
    break;
  case OMPC_dist_schedule:
    local_140 = OpenMPDistScheduleClause::addDistScheduleClause
                          (this,(OpenMPAffinityClauseModifier)local_d8);
    break;
  case OMPC_bind:
    local_140 = OpenMPBindClause::addBindClause(this,(OpenMPAffinityClauseModifier)local_d8);
    break;
  case OMPC_allocator:
    pcVar11 = local_d0;
    if ((OpenMPAffinityClauseModifier)local_d8 != 8) {
      pcVar11 = (char *)0x0;
    }
    local_140 = OpenMPAllocatorClause::addAllocatorClause
                          (this,(OpenMPAffinityClauseModifier)local_d8,pcVar11);
    break;
  case OMPC_initializer:
    pcVar11 = local_d0;
    if ((OpenMPAffinityClauseModifier)local_d8 != OMPC_AFFINITY_MODIFIER_unspecified) {
      pcVar11 = (char *)0x0;
    }
    local_140 = OpenMPInitializerClause::addInitializerClause
                          (this,(OpenMPAffinityClauseModifier)local_d8,pcVar11);
    break;
  case OMPC_in_reduction:
    pcVar11 = local_d0;
    if ((OpenMPAffinityClauseModifier)local_d8 != 0xc) {
      pcVar11 = (char *)0x0;
    }
    local_140 = OpenMPInReductionClause::addInReductionClause
                          (this,(OpenMPAffinityClauseModifier)local_d8,pcVar11);
    break;
  case OMPC_depend:
    local_140 = OpenMPDependClause::addDependClause
                          (this,(OpenMPAffinityClauseModifier)local_d8,
                           (OpenMPMapClauseModifier)local_d0);
    break;
  case OMPC_affinity:
    local_140 = OpenMPAffinityClause::addAffinityClause(this,(OpenMPAffinityClauseModifier)local_d8)
    ;
    break;
  case OMPC_atomic_default_mem_order:
    local_140 = OpenMPAtomicDefaultMemOrderClause::addAtomicDefaultMemOrderClause
                          (this,(OpenMPAffinityClauseModifier)local_d8);
    break;
  case OMPC_ext_implementation_defined_requirement:
    local_140 = OpenMPExtImplementationDefinedRequirementClause::
                addExtImplementationDefinedRequirementClause(this);
    break;
  case OMPC_device:
    local_140 = OpenMPDeviceClause::addDeviceClause(this,(OpenMPAffinityClauseModifier)local_d8);
    break;
  case OMPC_map:
    local_12c = (OpenMPAffinityClauseModifier)local_d8;
    type = (OpenMPMapClauseType)local_c0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,(char *)args[0].overflow_arg_area,&local_12d);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,CONCAT44(local_108._4_4_,local_108.first),
               (long)&((local_108.second)->
                      super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
                      super__Vector_impl_data._M_start + CONCAT44(local_108._4_4_,local_108.first));
    local_140 = OpenMPMapClause::addMapClause(this,local_12c,modifier2,modifier3,type,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_108._4_4_,local_108.first) != local_f8) {
      operator_delete((long *)CONCAT44(local_108._4_4_,local_108.first),local_f8[0] + 1);
    }
    break;
  case OMPC_defaultmap:
    local_140 = OpenMPDefaultmapClause::addDefaultmapClause
                          (this,(OpenMPAffinityClauseModifier)local_d8,
                           (OpenMPMapClauseModifier)local_d0);
    break;
  case OMPC_to:
    local_140 = OpenMPToClause::addToClause(this,(OpenMPAffinityClauseModifier)local_d8);
    break;
  case OMPC_from:
    local_140 = OpenMPFromClause::addFromClause(this,(OpenMPAffinityClauseModifier)local_d8);
    break;
  case OMPC_uses_allocators:
    local_140 = OpenMPUsesAllocatorsClause::addUsesAllocatorsClause(this);
    break;
  case OMPC_when:
    local_140 = OpenMPWhenClause::addWhenClause(this);
    break;
  case OMPC_match:
    local_140 = OpenMPMatchClause::addMatchClause(this);
    break;
  case OMPC_device_type:
    local_140 = OpenMPDeviceTypeClause::addDeviceTypeClause
                          (this,(OpenMPAffinityClauseModifier)local_d8);
    break;
  case OMPC_task_reduction:
    pcVar11 = local_d0;
    if ((OpenMPAffinityClauseModifier)local_d8 != 0xc) {
      pcVar11 = (char *)0x0;
    }
    local_140 = OpenMPTaskReductionClause::addTaskReductionClause
                          (this,(OpenMPAffinityClauseModifier)local_d8,pcVar11);
    break;
  case OMPC_depobj_update:
    local_140 = OpenMPDepobjUpdateClause::addDepobjUpdateClause
                          (this,(OpenMPAffinityClauseModifier)local_d8);
  }
  if ((local_140 != (OpenMPClause *)0x0) && (local_140->clause_position == -1)) {
    pvVar8 = (vector<OpenMPClause*,std::allocator<OpenMPClause*>> *)this->clauses_in_original_order;
    __position._M_current = *(OpenMPClause ***)(pvVar8 + 8);
    if (__position._M_current == *(OpenMPClause ***)(pvVar8 + 0x10)) {
      std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>::
      _M_realloc_insert<OpenMPClause*const&>(pvVar8,__position,&local_140);
    }
    else {
      *__position._M_current = local_140;
      *(long *)(pvVar8 + 8) = *(long *)(pvVar8 + 8) + 8;
    }
    local_140->clause_position =
         (int)((ulong)((long)(this->clauses_in_original_order->
                             super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->clauses_in_original_order->
                            super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  }
  return local_140;
}

Assistant:

OpenMPClause * OpenMPDirective::addOpenMPClause(int k, ... ) {

    OpenMPClauseKind kind = (OpenMPClauseKind)k;
    // Check whether the given kind of clause exists first.
    // If not, create an empty vector.
    if (clauses.count(kind) == 0) {
        clauses.insert(std::pair<OpenMPClauseKind, std::vector<OpenMPClause*>*>(kind, new std::vector<OpenMPClause*>));
    };
    std::vector<OpenMPClause*>* current_clauses = getClauses(kind);
    va_list args;
    va_start(args, k);
    OpenMPClause * new_clause = NULL;

    switch (kind) {
        case OMPC_num_threads:
        case OMPC_private:
        case OMPC_firstprivate:
        case OMPC_shared:
        case OMPC_num_teams:
        case OMPC_thread_limit:
        case OMPC_copyin:
        case OMPC_align:
        case OMPC_collapse:
        case OMPC_ordered:
        case OMPC_partial:
        case OMPC_nowait:
        case OMPC_full:
        case OMPC_safelen:
        case OMPC_simdlen:
        case OMPC_nontemporal:
        case OMPC_uniform:
        case OMPC_inbranch:
        case OMPC_notinbranch :
        case OMPC_copyprivate : 
        case OMPC_parallel:    
        case OMPC_sections: 
        case OMPC_for:
        case OMPC_do:
        case OMPC_taskgroup:
        case OMPC_inclusive:
        case OMPC_exclusive:
        case OMPC_use_device_ptr :
        case OMPC_use_device_addr :
        case OMPC_grainsize :
        case OMPC_num_tasks :
        case OMPC_nogroup :
        case OMPC_final :
        case OMPC_untied :
        case OMPC_mergeable :
        case OMPC_priority :
        case OMPC_detach :
        case OMPC_reverse_offload :
        case OMPC_unified_address :
        case OMPC_unified_shared_memory :
        case OMPC_dynamic_allocators :
        case OMPC_is_device_ptr :
        case OMPC_has_device_addr :
        case OMPC_link :
        case OMPC_threads:
        case OMPC_simd:
        case OMPC_acq_rel : 
        case OMPC_seq_cst : 
        case OMPC_release : 
        case OMPC_acquire : 
        case OMPC_relaxed : 
        case OMPC_read : 
        case OMPC_write : 
        case OMPC_update : 
        case OMPC_capture : 
        case OMPC_hint :
        case OMPC_destroy:
        case OMPC_sizes:
        
        {
            if (current_clauses->size() == 0) {
                new_clause = new OpenMPClause(kind);
                current_clauses = new std::vector<OpenMPClause*>();
                current_clauses->push_back(new_clause);
                clauses[kind] = current_clauses;
            } else {
                if (kind == OMPC_num_threads) {
                    std::cerr << "Cannot have two num_threads clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_simdlen) {
                    std::cerr << "Cannot have two simdlen clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_safelen) {
                    std::cerr << "Cannot have two safelen clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_seq_cst) {
                    std::cerr << "Cannot have two seq_cst clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_acq_rel) {
                    std::cerr << "Cannot have two acq_rel clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_release) {
                    std::cerr << "Cannot have two release clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_acquire) {
                    std::cerr << "Cannot have two acquire clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_relaxed) {
                    std::cerr << "Cannot have two relaxed clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_hint) {
                    std::cerr << "Cannot have two hint clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
            }
            break;
        }
        case OMPC_if : {
            OpenMPIfClauseModifier modifier = (OpenMPIfClauseModifier) va_arg(args,int);
            char * user_defined_modifier = NULL;
            if (modifier == OMPC_IF_MODIFIER_user)  user_defined_modifier = va_arg(args, char*);
            new_clause = OpenMPIfClause::addIfClause(this, modifier, user_defined_modifier);
            break;
        }
        case OMPC_default : {
            OpenMPDefaultClauseKind default_kind = (OpenMPDefaultClauseKind) va_arg(args, int);
            new_clause = OpenMPDefaultClause::addDefaultClause(this, default_kind);
            break;
        }
        case OMPC_order : {
            OpenMPOrderClauseKind order_kind = (OpenMPOrderClauseKind) va_arg(args, int);
            new_clause = OpenMPOrderClause::addOrderClause(this, order_kind);
            break;
        }
        case OMPC_ext_implementation_defined_requirement : {
            new_clause = OpenMPExtImplementationDefinedRequirementClause::addExtImplementationDefinedRequirementClause(this);
            break;
        }
        case OMPC_match: {
            new_clause = OpenMPMatchClause::addMatchClause(this);
            break;
        }

        case OMPC_reduction: {
            OpenMPReductionClauseModifier modifier = (OpenMPReductionClauseModifier) va_arg(args, int);
            OpenMPReductionClauseIdentifier identifier = (OpenMPReductionClauseIdentifier) va_arg(args, int);
            char * user_defined_identifier = NULL;
            if (identifier == OMPC_REDUCTION_IDENTIFIER_user) user_defined_identifier = va_arg(args, char *);
            new_clause = OpenMPReductionClause::addReductionClause(this, modifier, identifier, user_defined_identifier);
            break;
        }
        case OMPC_proc_bind: {
            OpenMPProcBindClauseKind proc_bind_kind = (OpenMPProcBindClauseKind) va_arg(args, int);
            new_clause = OpenMPProcBindClause::addProcBindClause(this, proc_bind_kind);
            break;
        } 
        case OMPC_uses_allocators: {
            new_clause = OpenMPUsesAllocatorsClause::addUsesAllocatorsClause(this);
            break;
        }
        case OMPC_bind: {
            OpenMPBindClauseBinding bind_binding = (OpenMPBindClauseBinding) va_arg(args, int);
            new_clause = OpenMPBindClause::addBindClause(this, bind_binding);
            break;
        }

        case OMPC_lastprivate: {
            OpenMPLastprivateClauseModifier modifier = (OpenMPLastprivateClauseModifier) va_arg(args,int);
            new_clause = OpenMPLastprivateClause::addLastprivateClause(this, modifier);
            break;
        }

        case OMPC_linear: {
            OpenMPLinearClauseModifier modifier = (OpenMPLinearClauseModifier) va_arg(args,int);
            new_clause = OpenMPLinearClause::addLinearClause(this, modifier);
            break;
        }
        case OMPC_aligned:{
            new_clause = OpenMPAlignedClause::addAlignedClause(this);
            break;
        }
        case OMPC_dist_schedule: {
            OpenMPDistScheduleClauseKind dist_schedule_kind = (OpenMPDistScheduleClauseKind) va_arg(args,int);
            new_clause = OpenMPDistScheduleClause::addDistScheduleClause(this, dist_schedule_kind);
            break;
        }
        case OMPC_schedule: {
            OpenMPScheduleClauseModifier modifier1 = (OpenMPScheduleClauseModifier) va_arg(args, int);
            OpenMPScheduleClauseModifier modifier2 = (OpenMPScheduleClauseModifier) va_arg(args, int);
            OpenMPScheduleClauseKind schedule_kind = (OpenMPScheduleClauseKind) va_arg(args, int);
            char * user_defined_kind = NULL;
            if (schedule_kind == OMPC_SCHEDULE_KIND_user) user_defined_kind = va_arg(args, char *);
            new_clause = OpenMPScheduleClause::addScheduleClause(this, modifier1, modifier2, schedule_kind, user_defined_kind);

            break;
        }
        case OMPC_device : {
            OpenMPDeviceClauseModifier modifier = (OpenMPDeviceClauseModifier) va_arg(args, int);
            new_clause = OpenMPDeviceClause::addDeviceClause(this, modifier);
            break;
}

        case OMPC_initializer:{
            OpenMPInitializerClausePriv priv = (OpenMPInitializerClausePriv) va_arg(args, int);
            char* user_defined_priv = NULL;
            if (priv == OMPC_INITIALIZER_PRIV_user) user_defined_priv = va_arg(args, char *);
            new_clause = OpenMPInitializerClause::addInitializerClause(this, priv, user_defined_priv);
            break;
        }
        case OMPC_allocate : {
            OpenMPAllocateClauseAllocator allocator = (OpenMPAllocateClauseAllocator) va_arg(args, int);
            char* user_defined_allocator = NULL;
            if (allocator == OMPC_ALLOCATE_ALLOCATOR_user) user_defined_allocator = va_arg(args, char *);
            new_clause = OpenMPAllocateClause::addAllocateClause(this, allocator, user_defined_allocator);
            break;
        }
        case OMPC_allocator : {
            OpenMPAllocatorClauseAllocator allocator = (OpenMPAllocatorClauseAllocator) va_arg(args, int);
            char* user_defined_allocator = NULL;
            if (allocator == OMPC_ALLOCATOR_ALLOCATOR_user) user_defined_allocator = va_arg(args, char *);
            new_clause = OpenMPAllocatorClause::addAllocatorClause(this, allocator, user_defined_allocator);
            
            break;
        }
        case OMPC_atomic_default_mem_order : {
            OpenMPAtomicDefaultMemOrderClauseKind atomic_default_mem_order_kind = (OpenMPAtomicDefaultMemOrderClauseKind) va_arg(args, int);
            new_clause = OpenMPAtomicDefaultMemOrderClause::addAtomicDefaultMemOrderClause(this, atomic_default_mem_order_kind);
            
            break;
        }
        case OMPC_in_reduction : {
            OpenMPInReductionClauseIdentifier identifier = (OpenMPInReductionClauseIdentifier) va_arg(args, int);
            char * user_defined_identifier = NULL;
            if (identifier == OMPC_IN_REDUCTION_IDENTIFIER_user) user_defined_identifier = va_arg(args, char *);
            new_clause = OpenMPInReductionClause::addInReductionClause(this, identifier, user_defined_identifier);
            break;
        }
        case OMPC_depobj_update : {
            OpenMPDepobjUpdateClauseDependeceType type = (OpenMPDepobjUpdateClauseDependeceType) va_arg(args, int);
            new_clause = OpenMPDepobjUpdateClause::addDepobjUpdateClause(this, type);            
            break;
        }
        case OMPC_depend : {
            OpenMPDependClauseModifier modifier = (OpenMPDependClauseModifier) va_arg(args, int);
            OpenMPDependClauseType type = (OpenMPDependClauseType) va_arg(args, int);
            new_clause = OpenMPDependClause::addDependClause(this, modifier, type);
            break;
        }
        case OMPC_affinity : {
            OpenMPAffinityClauseModifier modifier = (OpenMPAffinityClauseModifier) va_arg(args, int);
            new_clause = OpenMPAffinityClause::addAffinityClause(this, modifier);
            break;
        }
        case OMPC_to : {
            OpenMPToClauseKind to_kind = (OpenMPToClauseKind) va_arg(args, int);
            new_clause = OpenMPToClause::addToClause(this, to_kind);
            break;
        }
        case OMPC_from : {
            OpenMPFromClauseKind from_kind = (OpenMPFromClauseKind) va_arg(args, int);
            new_clause = OpenMPFromClause::addFromClause(this, from_kind);
            break;
        }

        case OMPC_device_type : {
            OpenMPDeviceTypeClauseKind device_type_kind = (OpenMPDeviceTypeClauseKind) va_arg(args, int);
            new_clause = OpenMPDeviceTypeClause::addDeviceTypeClause(this, device_type_kind);
            break;
        }
 
        case OMPC_defaultmap : {
            OpenMPDefaultmapClauseBehavior behavior = (OpenMPDefaultmapClauseBehavior) va_arg(args,int);
            OpenMPDefaultmapClauseCategory category = (OpenMPDefaultmapClauseCategory) va_arg(args,int);
            new_clause = OpenMPDefaultmapClause::addDefaultmapClause(this, behavior, category);
            break;        
        }
        case OMPC_task_reduction : {
            OpenMPTaskReductionClauseIdentifier identifier = (OpenMPTaskReductionClauseIdentifier) va_arg(args, int);
            char * user_defined_identifier = NULL;
            if (identifier == OMPC_TASK_REDUCTION_IDENTIFIER_user) user_defined_identifier = va_arg(args, char *);
            new_clause = OpenMPTaskReductionClause::addTaskReductionClause(this, identifier, user_defined_identifier);
            break;
        }
        case OMPC_map: {
            OpenMPMapClauseModifier modifier1 = (OpenMPMapClauseModifier)va_arg(args, int);
            OpenMPMapClauseModifier modifier2 = (OpenMPMapClauseModifier)va_arg(args, int);
            OpenMPMapClauseModifier modifier3 = (OpenMPMapClauseModifier)va_arg(args, int);
            OpenMPMapClauseType type = (OpenMPMapClauseType)va_arg(args, int);
            std::string mapper_identifier = (std::string)va_arg(args, char*);
            new_clause = OpenMPMapClause::addMapClause(this, modifier1, modifier2, modifier3, type, mapper_identifier);
            break;
        }
        case OMPC_when: {
            new_clause = OpenMPWhenClause::addWhenClause(this);
            break;
        }
        default: {
            ;
        }
    };

    va_end(args);
    if (new_clause != NULL && new_clause->getClausePosition() == -1) {
        this->getClausesInOriginalOrder()->push_back(new_clause);
        new_clause->setClausePosition(this->getClausesInOriginalOrder()->size()-1);
    };
    return new_clause;
}